

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

Hop_Obj_t * Hop_ObjReprHop(Hop_Obj_t *pObj)

{
  long *plVar1;
  Hop_Obj_t *pHVar2;
  
  pHVar2 = (pObj->field_1).pNext;
  if (pHVar2 == (Hop_Obj_t *)0x0) {
    __assert_fail("pObj->pNext != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                  ,0xbd,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
  }
  plVar1 = (long *)(pObj->field_0).pData;
  if (plVar1 != (long *)0x0) {
    if ((long *)*plVar1 != plVar1) {
      __assert_fail("pRepr->pData == pRepr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                    ,0xc1,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
    }
    pHVar2 = (Hop_Obj_t *)
             ((ulong)((*(uint *)(plVar1 + 4) ^ *(uint *)&pObj->field_0x20) >> 3 & 1) ^ plVar1[1]);
  }
  return pHVar2;
}

Assistant:

static inline Hop_Obj_t * Hop_ObjReprHop( Hop_Obj_t * pObj )
{
    Hop_Obj_t * pRepr;
    assert( pObj->pNext != NULL );
    if ( pObj->pData == NULL )
        return pObj->pNext;
    pRepr = (Hop_Obj_t *)pObj->pData;
    assert( pRepr->pData == pRepr );
    return Hop_NotCond( pRepr->pNext, pObj->fPhase ^ pRepr->fPhase );
}